

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall Nova::Driver<float,_2>::Read_Time(Driver<float,_2> *this,int frame)

{
  undefined8 *puVar1;
  Example<float,_2> *pEVar2;
  pointer pcVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  undefined8 *puVar8;
  long *plVar9;
  istream *piVar10;
  uint uVar11;
  int iVar12;
  size_type *psVar13;
  ulong uVar14;
  uint __val;
  uint __len;
  float corrected_time;
  string __str;
  string filename;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  string local_50;
  
  pEVar2 = this->example;
  this->time = (float)(frame - pEVar2->first_frame) / pEVar2->frame_rate + pEVar2->initial_time;
  local_90 = local_80;
  pcVar3 = (pEVar2->output_directory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar3,pcVar3 + (pEVar2->output_directory)._M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  __val = -frame;
  if (0 < frame) {
    __val = frame;
  }
  __len = 1;
  if (9 < __val) {
    uVar14 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar11 = (uint)uVar14;
      if (uVar11 < 100) {
        __len = __len - 2;
        goto LAB_001276d6;
      }
      if (uVar11 < 1000) {
        __len = __len - 1;
        goto LAB_001276d6;
      }
      if (uVar11 < 10000) goto LAB_001276d6;
      uVar14 = uVar14 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar11);
    __len = __len + 1;
  }
LAB_001276d6:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)(frame >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)frame >> 0x1f) + (long)local_70),__len,__val);
  uVar14 = 0xf;
  if (local_90 != local_80) {
    uVar14 = local_80[0];
  }
  if (uVar14 < (ulong)(local_68 + local_88)) {
    uVar14 = 0xf;
    if (local_70 != local_60) {
      uVar14 = local_60[0];
    }
    if ((ulong)(local_68 + local_88) <= uVar14) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
      goto LAB_0012776a;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70);
LAB_0012776a:
  local_b0 = &local_a0;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar8[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar8;
  }
  local_a8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_50.field_2._M_allocated_capacity = *psVar13;
    local_50.field_2._8_8_ = plVar9[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar13;
    local_50._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_50._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  bVar6 = File_Utilities::File_Exists(&local_50,true);
  if (bVar6) {
    piVar10 = File_Utilities::Safe_Open_Input(&local_50,true);
    std::istream::read((char *)piVar10,(long)&local_b0);
    (**(code **)(*(long *)piVar10 + 8))(piVar10);
    iVar7 = (int)this->time;
    iVar12 = (int)(this->time - local_b0._0_4_);
    iVar4 = -iVar12;
    if (0 < iVar12) {
      iVar4 = iVar12;
    }
    iVar12 = -iVar7;
    if (0 < iVar7) {
      iVar12 = iVar7;
    }
    if ((float)iVar12 * 0.0001 < (float)iVar4) {
      this->time = local_b0._0_4_;
      pEVar2 = this->example;
      pEVar2->initial_time =
           local_b0._0_4_ - (float)(frame - pEVar2->first_frame) / pEVar2->frame_rate;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Driver<T,d>::
Read_Time(const int frame)
{
    time=example.Time_At_Frame(frame);
    std::string filename=example.output_directory+"/"+std::to_string(frame)+"/time";
    if(File_Utilities::File_Exists(filename))
    {
        T corrected_time;
        File_Utilities::Read_From_File<T>(filename,corrected_time);
        if(abs(time-corrected_time)>(T)1e-4*abs(time))
        {   
            // only adjust time if significantly different from default in order to get deterministic restarts
            time=corrected_time;
            // adjust initial time so that Simulate_To_Frame() returns correct time (essential when writing substeps)
            example.initial_time=time-(frame-example.first_frame)/example.frame_rate;
        }
    }
}